

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::UnaryAggregateHeap<duckdb::string_t,_duckdb::LessThan>::Insert
          (UnaryAggregateHeap<duckdb::string_t,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          string_t *value)

{
  undefined4 uVar1;
  ulong uVar2;
  bool bVar3;
  char (**ppacVar4) [4];
  idx_t iVar5;
  HeapEntry<duckdb::string_t> *pHVar6;
  HeapEntry<duckdb::string_t> *other;
  _Iter_comp_val<bool_(*)(const_duckdb::HeapEntry<duckdb::string_t>_&,_const_duckdb::HeapEntry<duckdb::string_t>_&)>
  __cmp;
  _ValueType __value;
  undefined1 local_78 [16];
  uint32_t local_68;
  char (*local_60) [4];
  _Iter_comp_val<bool_(*)(const_duckdb::HeapEntry<duckdb::string_t>_&,_const_duckdb::HeapEntry<duckdb::string_t>_&)>
  local_58;
  anon_union_16_2_67f50693_for_value local_50;
  uint32_t local_40;
  char (*local_38) [4];
  
  uVar2 = this->size;
  if (uVar2 < this->capacity) {
    this->size = uVar2 + 1;
    pHVar6 = this->heap + uVar2;
  }
  else {
    bVar3 = string_t::StringComparisonOperators::GreaterThan(&this->heap->value,value);
    if (!bVar3) {
      return;
    }
    pHVar6 = this->heap;
    iVar5 = this->size;
    if (1 < (long)iVar5) {
      other = pHVar6 + (iVar5 - 1);
      HeapEntry<duckdb::string_t>::HeapEntry((HeapEntry<duckdb::string_t> *)&local_50.pointer,other)
      ;
      HeapEntry<duckdb::string_t>::operator=(other,pHVar6);
      if ((uint)local_50._0_4_ < 0xd) {
        ppacVar4 = &local_60;
        local_78._8_8_ = local_50.pointer.ptr;
        local_68 = 0;
        uVar1 = local_50.pointer.prefix;
      }
      else {
        ppacVar4 = &local_38;
        local_68 = local_40;
        local_60 = local_38;
        uVar1 = *local_38;
        local_78._8_8_ = local_38;
      }
      local_78[4] = (char)uVar1;
      local_78[5] = SUB41(uVar1,1);
      local_78[6] = SUB41(uVar1,2);
      local_78[7] = SUB41(uVar1,3);
      local_78._0_4_ = local_50.pointer.length;
      *ppacVar4 = (char (*) [4])0x0;
      ::std::
      __adjust_heap<duckdb::HeapEntry<duckdb::string_t>*,long,duckdb::HeapEntry<duckdb::string_t>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(duckdb::HeapEntry<duckdb::string_t>const&,duckdb::HeapEntry<duckdb::string_t>const&)>>
                (pHVar6,0,(long)other - (long)pHVar6 >> 5,(HeapEntry<duckdb::string_t> *)local_78,
                 (_Iter_comp_iter<bool_(*)(const_duckdb::HeapEntry<duckdb::string_t>_&,_const_duckdb::HeapEntry<duckdb::string_t>_&)>
                  )0x7d0620);
      pHVar6 = this->heap;
      iVar5 = this->size;
    }
    pHVar6 = pHVar6 + (iVar5 - 1);
  }
  HeapEntry<duckdb::string_t>::Assign(pHVar6,allocator,value);
  pHVar6 = this->heap;
  iVar5 = this->size;
  local_58._M_comp = Compare;
  HeapEntry<duckdb::string_t>::HeapEntry
            ((HeapEntry<duckdb::string_t> *)&local_50.pointer,pHVar6 + (iVar5 - 1));
  if ((uint)local_50._0_4_ < 0xd) {
    ppacVar4 = &local_60;
    local_78._8_8_ = local_50.pointer.ptr;
    local_68 = 0;
  }
  else {
    ppacVar4 = &local_38;
    local_68 = local_40;
    local_60 = local_38;
    local_50.pointer.prefix = *local_38;
    local_78._8_8_ = local_38;
  }
  local_78[4] = local_50.pointer.prefix[0];
  local_78[5] = local_50.pointer.prefix[1];
  local_78[6] = local_50.pointer.prefix[2];
  local_78[7] = local_50.pointer.prefix[3];
  local_78._0_4_ = local_50.pointer.length;
  *ppacVar4 = (char (*) [4])0x0;
  ::std::
  __push_heap<duckdb::HeapEntry<duckdb::string_t>*,long,duckdb::HeapEntry<duckdb::string_t>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(duckdb::HeapEntry<duckdb::string_t>const&,duckdb::HeapEntry<duckdb::string_t>const&)>>
            (pHVar6,iVar5 - 1,0,(HeapEntry<duckdb::string_t> *)local_78,&local_58);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}